

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSolSpace_SPBCGS(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype lrw1;
  sunindextype liw1;
  SUNContext_conflict sunctx_local_scope_;
  long local_30;
  long local_28;
  long local_20;
  long *local_18;
  long *local_10;
  
  local_20 = in_RDI[2];
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(*(long *)(*(long *)(*in_RDI + 0x88) + 8) + 0x20) == 0) {
    local_28 = 0;
    local_30 = 0;
  }
  else {
    N_VSpace(*(undefined8 *)(*in_RDI + 0x88),&local_30,&local_28);
  }
  *local_10 = local_30 * 9;
  *local_18 = local_28 * 9;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_SPBCGS(SUNLinearSolver S, long int* lenrwLS,
                                 long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  sunindextype liw1, lrw1;
  if (SPBCGS_CONTENT(S)->vtemp->ops->nvspace)
  {
    N_VSpace(SPBCGS_CONTENT(S)->vtemp, &lrw1, &liw1);
    SUNCheckLastErr();
  }
  else { lrw1 = liw1 = 0; }
  *lenrwLS = lrw1 * 9;
  *leniwLS = liw1 * 9;
  return SUN_SUCCESS;
}